

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteFields<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool *first)

{
  bool bVar1;
  size_t sVar2;
  WriterOptions *pWVar3;
  reference ppFVar4;
  bool local_ca;
  Field *field_1;
  iterator __end0;
  iterator __begin0;
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  *__range3;
  Field pFStack_70;
  bool has;
  Field<google::protobuf::json_internal::UnparseProto3Type> field;
  size_t i;
  Field<google::protobuf::json_internal::UnparseProto3Type> local_50;
  size_t total;
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  fields;
  bool *first_local;
  Desc<google::protobuf::json_internal::UnparseProto3Type> *desc_local;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *msg_local;
  JsonWriter *writer_local;
  Status *_status;
  
  fields.
  super__Vector_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)first;
  std::
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::vector((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
            *)&total);
  local_50 = (Field<google::protobuf::json_internal::UnparseProto3Type>)Proto3Type::FieldCount(desc)
  ;
  std::
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::reserve((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
             *)&total,(size_type)local_50);
  for (field = (Field<google::protobuf::json_internal::UnparseProto3Type>)0x0; field < local_50;
      field = (Field<google::protobuf::json_internal::UnparseProto3Type>)((long)&field->pool_ + 1))
  {
    pFStack_70 = Proto3Type::FieldByIndex(desc,(size_t)field);
    sVar2 = UnparseProto3Type::GetSize(pFStack_70,msg);
    __range3._7_1_ = sVar2 != 0;
    pWVar3 = JsonWriter::options(writer);
    if ((pWVar3->always_print_fields_with_no_presence & 1U) != 0) {
      bVar1 = Proto3Type::IsRepeated(pFStack_70);
      local_ca = true;
      if (!bVar1) {
        local_ca = Proto3Type::IsImplicitPresence(pFStack_70);
      }
      __range3._7_1_ = (__range3._7_1_ & 1) != 0 || local_ca != false;
    }
    if ((__range3._7_1_ & 1) != 0) {
      std::
      vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
      ::push_back((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                   *)&total,&stack0xffffffffffffff90);
    }
  }
  UnparseProto3Type::FindAndAppendExtensions
            (msg,(vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                  *)&total);
  absl::lts_20240722::
  c_sort<std::vector<google::protobuf::json_internal::ResolverPool::Field_const*,std::allocator<google::protobuf::json_internal::ResolverPool::Field_const*>>,google::protobuf::json_internal::(anonymous_namespace)::WriteFields<google::protobuf::json_internal::UnparseProto3Type>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto3Type::Msg_const&,google::protobuf::json_internal::UnparseProto3Type::Desc_const&,bool&)::_lambda(auto:1_const&,auto:2_const&)_1_>
            ((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
              *)&total,(anon_class_1_0_00000001 *)((long)&__range3 + 6));
  __end0 = std::
           vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
           ::begin((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                    *)&total);
  field_1 = (Field *)std::
                     vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                     ::end((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
                            *)&total);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_google::protobuf::json_internal::ResolverPool::Field_**,_std::vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
                                     *)&field_1), bVar1) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::json_internal::ResolverPool::Field_**,_std::vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
              ::operator*(&__end0);
    WriteField<google::protobuf::json_internal::UnparseProto3Type>
              ((JsonWriter *)this,(Msg<google::protobuf::json_internal::UnparseProto3Type> *)writer,
               (Field<google::protobuf::json_internal::UnparseProto3Type>)msg,(bool *)*ppFVar4);
    bVar1 = absl::lts_20240722::Status::ok((Status *)this);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_004e13f3;
    absl::lts_20240722::Status::~Status((Status *)this);
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::json_internal::ResolverPool::Field_**,_std::vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>_>
    ::operator++(&__end0);
  }
  absl::lts_20240722::OkStatus();
LAB_004e13f3:
  std::
  vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
  ::~vector((vector<const_google::protobuf::json_internal::ResolverPool::Field_*,_std::allocator<const_google::protobuf::json_internal::ResolverPool::Field_*>_>
             *)&total);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteFields(JsonWriter& writer, const Msg<Traits>& msg,
                         const Desc<Traits>& desc, bool& first) {
  std::vector<Field<Traits>> fields;
  size_t total = Traits::FieldCount(desc);
  fields.reserve(total);
  for (size_t i = 0; i < total; ++i) {
    Field<Traits> field = Traits::FieldByIndex(desc, i);

    bool has = Traits::GetSize(field, msg) > 0;

    if (writer.options().always_print_fields_with_no_presence) {
      has |= Traits::IsRepeated(field) || Traits::IsImplicitPresence(field);
    }

    if (has) {
      fields.push_back(field);
    }
  }

  // Add extensions *before* sorting.
  Traits::FindAndAppendExtensions(msg, fields);

  // Fields are guaranteed to be serialized in field number order.
  absl::c_sort(fields, [](const auto& a, const auto& b) {
    return Traits::FieldNumber(a) < Traits::FieldNumber(b);
  });

  for (auto field : fields) {
    RETURN_IF_ERROR(WriteField<Traits>(writer, msg, field, first));
  }

  return absl::OkStatus();
}